

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O1

bool __thiscall QMilankovicCalendar::isLeapYear(QMilankovicCalendar *this,int year)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)(year < 1) + year;
  if ((uVar4 & 3) != 0) {
    return false;
  }
  if ((int)uVar4 < 0) {
    uVar4 = uVar4 | 1;
    iVar2 = (int)uVar4 >> 0x1f;
    iVar1 = (int)uVar4 / 100 + iVar2;
    uVar3 = (iVar1 - iVar2) - 1;
    uVar4 = uVar4 + (iVar1 - iVar2) * -100 + 99;
  }
  else {
    uVar3 = uVar4 / 100;
    uVar4 = uVar4 % 100;
  }
  if (uVar4 == 0) {
    if ((int)uVar3 < 0) {
      uVar3 = (int)(uVar3 + 1) % 9 + 8;
    }
    else {
      uVar3 = uVar3 % 9;
    }
    if ((uVar3 & 0xfffb) != 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool QMilankovicCalendar::isLeapYear(int year) const
{
    if (year == QCalendar::Unspecified)
        return false;
    if (year <= 0)
        ++year;
    if (qMod<4>(year))
        return false;
    const auto yeardm = qDivMod<100>(year);
    if (yeardm.remainder == 0) {
        const qint16 century = qMod<9>(yeardm.quotient);
        if (century != 2 && century != 6)
            return false;
    }
    return true;
}